

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

int newlabelentry(LexState *ls,Labellist *l,TString *name,int line,int pc)

{
  int nelems;
  Labeldesc *pLVar1;
  
  nelems = l->n;
  pLVar1 = (Labeldesc *)luaM_growaux_(ls->L,l->arr,nelems,&l->size,0x18,0x7fff,"labels/gotos");
  l->arr = pLVar1;
  pLVar1[nelems].name = name;
  pLVar1[nelems].line = line;
  pLVar1[nelems].nactvar = ls->fs->nactvar;
  pLVar1[nelems].close = '\0';
  pLVar1[nelems].pc = pc;
  l->n = nelems + 1;
  return nelems;
}

Assistant:

static int newlabelentry (LexState *ls, Labellist *l, TString *name,
                          int line, int pc) {
  int n = l->n;
  luaM_growvector(ls->L, l->arr, n, l->size,
                  Labeldesc, SHRT_MAX, "labels/gotos");
  l->arr[n].name = name;
  l->arr[n].line = line;
  l->arr[n].nactvar = ls->fs->nactvar;
  l->arr[n].close = 0;
  l->arr[n].pc = pc;
  l->n = n + 1;
  return n;
}